

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

void __thiscall HighsCliqueTable::runCliqueMerging(HighsCliqueTable *this,HighsDomain *globaldomain)

{
  pointer *ppCVar1;
  HighsInt *pHVar2;
  double *pdVar3;
  double dVar4;
  CliqueVar CVar5;
  int iVar6;
  pointer pCVar7;
  pointer piVar8;
  pointer pCVar9;
  pointer puVar10;
  iterator __position;
  iterator __position_00;
  vector<std::pair<int,HighsCliqueTable::CliqueVar>,std::allocator<std::pair<int,HighsCliqueTable::CliqueVar>>>
  *pvVar11;
  HighsInt i;
  HighsInt HVar12;
  uint uVar13;
  ulong uVar14;
  ValueType *pVVar15;
  CliqueVar *pCVar16;
  CliqueVar *pCVar17;
  uint uVar18;
  pointer pdVar19;
  long lVar20;
  ulong uVar21;
  pointer puVar22;
  CliqueVar *pCVar23;
  const_iterator __cbeg;
  ulong uVar24;
  CliqueVar *q;
  pointer pCVar25;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range2;
  int iVar26;
  pointer pdVar27;
  iterator __end3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  CliqueVar CVar28;
  long lVar29;
  int *piVar30;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> extensionvars;
  HighsInt originrow;
  HighsInt cliqueid;
  CliqueVar v;
  vector<int,_std::allocator<int>_> neighbourhoodInds;
  anon_class_24_3_1a0f6629 addCands;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> local_108;
  int local_ec;
  anon_class_8_1_9cafd1bc_conflict local_e8;
  HighsDomain *local_e0;
  HighsCliqueTable *local_d8;
  ulong local_d0;
  int local_c4;
  uint local_c0;
  CliqueVar local_bc;
  ulong local_b8;
  int *local_b0;
  vector<std::pair<int,HighsCliqueTable::CliqueVar>,std::allocator<std::pair<int,HighsCliqueTable::CliqueVar>>>
  *local_a8;
  ulong local_a0;
  ulong local_98;
  int64_t *local_90;
  vector<int,std::allocator<int>> *local_88;
  HighsRandom *local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_78;
  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *local_70;
  vector<int,_std::allocator<int>_> local_68;
  HighsCliqueTable *local_48;
  HighsDomain *local_40;
  pointer local_38;
  
  local_108.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_start = (CliqueVar *)0x0;
  local_108.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_finish = (CliqueVar *)0x0;
  local_108.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->iscandidate;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (this_00,(long)(this->invertedHashList).
                           super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->invertedHashList).
                           super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&local_68,
             (long)(this->invertedHashList).
                   super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->invertedHashList).
                   super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  uVar24 = ((long)(this->cliques).
                  super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->cliques).
                  super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
  if ((ulong)((long)(this->cliquehits).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->cliquehits).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) < uVar24) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->cliquehits,uVar24);
    uVar24 = ((long)(this->cliques).
                    super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->cliques).
                    super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
  }
  iVar26 = this->numEntries;
  local_c4 = HighsSparseMatrix::numNz(&globaldomain->mipsolver->model_->a_matrix_);
  if ((int)uVar24 != 0) {
    local_c4 = local_c4 + iVar26;
    local_90 = &this->numNeighbourhoodQueries;
    local_80 = &this->randgen;
    local_70 = (vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *)
               &this->infeasvertexstack;
    local_a8 = (vector<std::pair<int,HighsCliqueTable::CliqueVar>,std::allocator<std::pair<int,HighsCliqueTable::CliqueVar>>>
                *)&this->cliqueextensions;
    local_88 = (vector<int,std::allocator<int>> *)&this->deletedrows;
    uVar24 = uVar24 & 0xffffffff;
    uVar14 = 0;
    local_a0 = 0;
    local_e0 = globaldomain;
    local_d8 = this;
    local_98 = uVar24;
    local_78 = this_00;
    do {
      pCVar7 = (this->cliques).
               super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar26 = pCVar7[uVar14].start;
      if (((long)iVar26 != -1) &&
         ((pCVar7[uVar14].origin != 0x7fffffff | pCVar7[uVar14].equality) == 1)) {
        if (pCVar7[uVar14].origin == -1) {
          local_a0 = CONCAT71((int7)(int3)((uint)iVar26 >> 8),1);
        }
        else {
          uVar18 = pCVar7[uVar14].end - iVar26;
          if (uVar18 != 0) {
            pCVar16 = (this->cliqueentries).
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar26;
            CVar28 = *pCVar16;
            uVar24 = (ulong)uVar18;
            if (uVar18 != 1) {
              piVar8 = (this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar26 = piVar8[(int)((int)CVar28 << 1 | (uint)((int)CVar28 < 0))];
              uVar21 = 1;
              do {
                CVar5 = pCVar16[uVar21];
                iVar6 = piVar8[(int)((int)CVar5 << 1 | (uint)((int)CVar5 < 0))];
                if (iVar6 < iVar26) {
                  iVar26 = iVar6;
                  CVar28 = CVar5;
                }
                uVar21 = uVar21 + 1;
              } while (uVar24 != uVar21);
            }
            uVar21 = 0;
            do {
              (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start
              [(int)((int)pCVar16[uVar21] << 1 | (uint)((int)pCVar16[uVar21] < 0))] = '\x01';
              uVar21 = uVar21 + 1;
            } while (uVar24 != uVar21);
            local_40 = local_e0;
            local_b0 = (int *)(long)(int)((int)CVar28 << 1 | (uint)((int)CVar28 < 0));
            local_e8.addCands = (anon_class_24_3_1a0f6629 *)&stack0xffffffffffffffb8;
            local_d0 = uVar14 * 5;
            local_b8 = uVar14;
            local_48 = this;
            local_38 = (pointer)&local_108;
            HighsHashTree<int,_int>::
            for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:2113:9)_&,_0>
                      ((NodePtr)(this->invertedHashList).
                                super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(long)local_b0].root.
                                ptrAndType,&local_e8);
            local_e8.addCands = (anon_class_24_3_1a0f6629 *)&stack0xffffffffffffffb8;
            HighsHashTree<int,_void>::
            for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:2116:9)_&,_0>
                      ((NodePtr)(local_d8->invertedHashListSizeTwo).
                                super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(long)local_b0].root.
                                ptrAndType,&local_e8);
            uVar14 = 0;
            do {
              (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start
              [(int)((int)pCVar16[uVar14] << 1 | (uint)((int)pCVar16[uVar14] < 0))] = '\0';
              uVar14 = uVar14 + 1;
              pCVar17 = local_108.
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar24 != uVar14);
            for (; pCVar17 !=
                   local_108.
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pCVar17 = pCVar17 + 1) {
              (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start
              [(int)((int)*pCVar17 << 1 | (uint)((int)*pCVar17 < 0))] = '\0';
            }
            uVar14 = 0;
            q = local_108.
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_start;
            pCVar17 = local_108.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            do {
              if (q == pCVar17) break;
              if (pCVar16[uVar14] != CVar28) {
                HVar12 = shrinkToNeighbourhood
                                   (local_d8,&local_68,local_90,pCVar16[uVar14],q,
                                    (HighsInt)((ulong)((long)pCVar17 - (long)q) >> 2));
                pCVar17 = local_108.
                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ._M_impl.super__Vector_impl_data._M_start + HVar12;
                q = local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_start;
                if (pCVar17 !=
                    local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  local_108.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pCVar17;
                }
              }
              uVar14 = uVar14 + 1;
            } while (uVar24 != uVar14);
            globaldomain = local_e0;
            if (q != pCVar17) {
              HighsRandom::shuffle<HighsCliqueTable::CliqueVar>
                        (local_80,q,(HighsInt)((ulong)((long)pCVar17 - (long)q) >> 2));
              globaldomain = local_e0;
              q = local_108.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_start;
              pCVar17 = local_108.
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if ((long)local_108.
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_108.
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_start != 0) {
                uVar24 = (long)local_108.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_108.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2;
                iVar26 = -1;
                lVar29 = 4;
                uVar14 = 0;
                do {
                  HVar12 = shrinkToNeighbourhood
                                     (local_d8,&local_68,local_90,
                                      local_108.
                                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar14],
                                      (CliqueVar *)
                                      ((long)&(local_108.
                                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->field_0x0
                                      + lVar29),(int)uVar24 + iVar26);
                  uVar24 = (ulong)(HVar12 + (int)uVar14 + 1);
                  pCVar17 = local_108.
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar24;
                  if (pCVar17 !=
                      local_108.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish = pCVar17;
                  }
                  uVar14 = uVar14 + 1;
                  iVar26 = iVar26 + -1;
                  lVar29 = lVar29 + 4;
                  q = local_108.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start;
                } while (uVar14 < uVar24);
              }
            }
            this = local_d8;
            pCVar7 = (local_d8->cliques).
                     super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((&pCVar7->equality)[local_d0 * 4] == true) {
              for (; q != pCVar17; q = q + 1) {
                vertexInfeasible(this,globaldomain,(uint)*q & 0x7fffffff,(uint)*q >> 0x1f);
              }
            }
            else {
              pHVar2 = &pCVar7->start + local_d0;
              local_ec = pHVar2[2];
              pHVar2[2] = 0x7fffffff;
              pCVar9 = (local_d8->cliqueentries).
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
                        ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                          *)&local_108,pCVar17,pCVar9 + *pHVar2,pCVar9 + pHVar2[1]);
              lVar29 = ((long)pCVar17 - (long)q) * 0x40000000 >> 0x1e;
              pCVar16 = (CliqueVar *)
                        ((long)&(local_108.
                                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar29);
              uVar24 = (long)local_108.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar16;
              if (0 < (long)uVar24 >> 4) {
                puVar22 = (this->colDeleted).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pCVar16 = (CliqueVar *)((long)&pCVar16->field_0x0 + (uVar24 & 0xfffffffffffffff0));
                lVar20 = ((long)uVar24 >> 4) + 1;
                pCVar23 = (CliqueVar *)
                          ((long)&local_108.
                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                  ._M_impl.super__Vector_impl_data._M_start[2].field_0x0 + lVar29);
                do {
                  if (puVar22[(uint)pCVar23[-2] & 0x7fffffff] != '\0') {
                    pCVar23 = pCVar23 + -2;
                    goto LAB_00262f19;
                  }
                  if (puVar22[(uint)pCVar23[-1] & 0x7fffffff] != '\0') {
                    pCVar23 = pCVar23 + -1;
                    goto LAB_00262f19;
                  }
                  if (puVar22[(uint)*pCVar23 & 0x7fffffff] != '\0') goto LAB_00262f19;
                  if (puVar22[(uint)pCVar23[1] & 0x7fffffff] != '\0') {
                    pCVar23 = pCVar23 + 1;
                    goto LAB_00262f19;
                  }
                  lVar20 = lVar20 + -1;
                  pCVar23 = pCVar23 + 4;
                } while (1 < lVar20);
                uVar24 = (long)local_108.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar16;
              }
              lVar29 = (long)uVar24 >> 2;
              if (lVar29 == 3) {
                puVar22 = (this->colDeleted).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pCVar23 = pCVar16;
                if (puVar22[(uint)*pCVar16 & 0x7fffffff] == '\0') {
                  pCVar16 = pCVar16 + 1;
                  goto LAB_00262eee;
                }
LAB_00262f19:
                pCVar16 = pCVar23 + 1;
                if (pCVar16 !=
                    local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish &&
                    pCVar23 !=
                    local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  do {
                    if ((this->colDeleted).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start[(uint)*pCVar16 & 0x7fffffff] == '\0') {
                      *pCVar23 = *pCVar16;
                      pCVar23 = pCVar23 + 1;
                    }
                    pCVar16 = pCVar16 + 1;
                  } while (pCVar16 !=
                           local_108.
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
                }
                if (pCVar23 !=
                    local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  local_108.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pCVar23;
                }
              }
              else {
                if (lVar29 == 2) {
                  puVar22 = (this->colDeleted).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
LAB_00262eee:
                  pCVar23 = pCVar16;
                  if (puVar22[(uint)*pCVar16 & 0x7fffffff] == '\0') {
                    pCVar16 = pCVar16 + 1;
                    goto LAB_00262f00;
                  }
                  goto LAB_00262f19;
                }
                if (lVar29 == 1) {
                  puVar22 = (this->colDeleted).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
LAB_00262f00:
                  pCVar23 = pCVar16;
                  if (puVar22[(uint)*pCVar16 & 0x7fffffff] == '\0') {
                    pCVar23 = local_108.
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                  goto LAB_00262f19;
                }
              }
              removeClique(this,(HighsInt)local_b8);
              pCVar9 = local_108.
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pCVar25 = local_108.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_start; this = local_d8,
                  pCVar25 != pCVar9; pCVar25 = pCVar25 + 1) {
                uVar18 = (int)*pCVar25 << 1 | (uint)((int)*pCVar25 < 0);
                local_e8.addCands = (anon_class_24_3_1a0f6629 *)local_d8;
                HighsHashTree<int,_int>::
                for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:2167:46)_&,_0>
                          ((NodePtr)(local_d8->invertedHashList).
                                    super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(int)uVar18].root.
                                    ptrAndType,(anon_class_8_1_8991fb9c *)&local_e8);
                local_e8.addCands = (anon_class_24_3_1a0f6629 *)this;
                HighsHashTree<int,_void>::
                for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:2173:53)_&,_0>
                          ((NodePtr)(this->invertedHashListSizeTwo).
                                    super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(int)uVar18].root.
                                    ptrAndType,(anon_class_8_1_8991fb9c *)&local_e8);
              }
              piVar30 = (local_d8->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              local_b0 = (local_d8->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              uVar18 = (uint)((ulong)((long)pCVar17 - (long)q) >> 2);
              if (piVar30 != local_b0) {
                local_c0 = 0x7fffffff;
                local_d0 = local_d0 & 0xffffffff00000000;
                do {
                  pCVar9 = local_108.
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  iVar26 = *piVar30;
                  local_e8.addCands._0_4_ = iVar26;
                  puVar10 = (this->cliquehits).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar13 = puVar10[iVar26];
                  puVar10[iVar26] = 0;
                  pCVar7 = (this->cliques).
                           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if (uVar13 == (uint)((ulong)((long)local_108.
                                                                                                          
                                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_108.
                                                                                                        
                                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2))
                  {
                    local_d0 = CONCAT44(local_d0._4_4_,(int)CONCAT71((int7)((ulong)pCVar7 >> 8),1));
                    if ((pCVar7[iVar26].origin | 0x80000000U) != 0xffffffff) {
                      local_c0 = pCVar7[iVar26].origin;
                    }
                  }
                  else if (pCVar7[iVar26].end - (pCVar7[iVar26].start + pCVar7[iVar26].numZeroFixed)
                           == uVar13) {
                    pCVar25 = local_108.
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if (pCVar7[iVar26].equality == true) {
                      for (; pCVar25 != pCVar9; pCVar25 = pCVar25 + 1) {
                        local_bc = *pCVar25;
                        pCVar7 = (this->cliques).
                                 super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        uVar13 = (int)local_bc << 1 | (uint)((int)local_bc < 0);
                        uVar24 = ((ulong)local_e8.addCands & 0xffffffff) * -0x7f3769c41c1b3d0d +
                                 0x9eefcacfe7301de3 >> 0x20 ^
                                 ((ulong)local_e8.addCands & 0xffffffff) * -0x75e7c76a1153eaca +
                                 0x1da24fc66dd63e32;
                        if (pCVar7[(int)local_e8.addCands].end -
                            pCVar7[(int)local_e8.addCands].start == 2) {
                          pVVar15 = HighsHashTree<int,_void>::find_recurse
                                              ((NodePtr)(this->invertedHashListSizeTwo).
                                                                                                                
                                                  super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)uVar13].root.ptrAndType,uVar24,0,
                                               (int *)&local_e8);
                        }
                        else {
                          pVVar15 = HighsHashTree<int,_int>::find_recurse
                                              ((NodePtr)(this->invertedHashList).
                                                                                                                
                                                  super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)uVar13].root.ptrAndType,uVar24,0,
                                               (int *)&local_e8);
                        }
                        if (pVVar15 == (ValueType *)0x0) {
                          __position._M_current =
                               (this->infeasvertexstack).
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                          if (__position._M_current ==
                              (this->infeasvertexstack).
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::
                            vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                            ::_M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                                      (local_70,__position,&local_bc);
                          }
                          else {
                            *__position._M_current = local_bc;
                            ppCVar1 = &(this->infeasvertexstack).
                                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                       ._M_impl.super__Vector_impl_data._M_finish;
                            *ppCVar1 = *ppCVar1 + 1;
                          }
                        }
                      }
                    }
                    else {
                      removeClique(this,iVar26);
                    }
                  }
                  pvVar11 = local_a8;
                  globaldomain = local_e0;
                  piVar30 = piVar30 + 1;
                } while (piVar30 != local_b0);
                piVar8 = (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_start;
                if ((this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish != piVar8) {
                  (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = piVar8;
                }
                if ((local_d0 & 1) != 0) {
                  if (local_c0 == 0x7fffffff) {
                    if (0 < (int)uVar18) {
                      uVar24 = (ulong)(uVar18 & 0x7fffffff);
                      lVar29 = 0;
                      do {
                        std::
                        vector<std::pair<int,HighsCliqueTable::CliqueVar>,std::allocator<std::pair<int,HighsCliqueTable::CliqueVar>>>
                        ::emplace_back<int&,HighsCliqueTable::CliqueVar&>
                                  (pvVar11,&local_ec,
                                   (CliqueVar *)
                                   ((long)&(local_108.
                                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->field_0x0 +
                                   lVar29));
                        lVar29 = lVar29 + 4;
                        uVar24 = uVar24 - 1;
                      } while (uVar24 != 0);
                    }
                  }
                  else {
                    __position_00._M_current =
                         (this->deletedrows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (__position_00._M_current ==
                        (this->deletedrows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (local_88,__position_00,&local_ec);
                    }
                    else {
                      *__position_00._M_current = local_ec;
                      (this->deletedrows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = __position_00._M_current + 1;
                    }
                  }
                  goto LAB_0026350d;
                }
              }
              pvVar11 = local_a8;
              globaldomain = local_e0;
              if (0 < (int)uVar18) {
                uVar24 = (ulong)(uVar18 & 0x7fffffff);
                lVar29 = 0;
                do {
                  std::
                  vector<std::pair<int,HighsCliqueTable::CliqueVar>,std::allocator<std::pair<int,HighsCliqueTable::CliqueVar>>>
                  ::emplace_back<int&,HighsCliqueTable::CliqueVar&>
                            (pvVar11,&local_ec,
                             (CliqueVar *)
                             ((long)&(local_108.
                                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar29
                             ));
                  lVar29 = lVar29 + 4;
                  uVar24 = uVar24 - 1;
                } while (uVar24 != 0);
              }
              uVar24 = (long)local_108.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_108.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              pCVar16 = local_108.
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (0 < (long)uVar24 >> 4) {
                pdVar27 = (globaldomain->col_lower_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar19 = (globaldomain->col_upper_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                uVar14 = uVar24 & 0xfffffffffffffff0;
                lVar29 = ((long)uVar24 >> 4) + 1;
                pCVar16 = local_108.
                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ._M_impl.super__Vector_impl_data._M_start + 2;
                do {
                  uVar18 = (uint)pCVar16[-2] & 0x7fffffff;
                  dVar4 = pdVar27[uVar18];
                  if (((dVar4 == pdVar19[uVar18]) && (!NAN(dVar4) && !NAN(pdVar19[uVar18]))) &&
                     ((int)dVar4 == ~(uint)pCVar16[-2] >> 0x1f)) {
                    pCVar16 = pCVar16 + -2;
                    goto LAB_00263477;
                  }
                  uVar18 = (uint)pCVar16[-1] & 0x7fffffff;
                  dVar4 = pdVar27[uVar18];
                  if (((dVar4 == pdVar19[uVar18]) && (!NAN(dVar4) && !NAN(pdVar19[uVar18]))) &&
                     ((int)dVar4 == ~(uint)pCVar16[-1] >> 0x1f)) {
                    pCVar16 = pCVar16 + -1;
                    goto LAB_00263477;
                  }
                  uVar18 = (uint)*pCVar16 & 0x7fffffff;
                  dVar4 = pdVar27[uVar18];
                  if (((dVar4 == pdVar19[uVar18]) && (!NAN(dVar4) && !NAN(pdVar19[uVar18]))) &&
                     ((int)dVar4 == ~(uint)*pCVar16 >> 0x1f)) goto LAB_00263477;
                  uVar18 = (uint)pCVar16[1] & 0x7fffffff;
                  dVar4 = pdVar27[uVar18];
                  if (((dVar4 == pdVar19[uVar18]) && (!NAN(dVar4) && !NAN(pdVar19[uVar18]))) &&
                     ((int)dVar4 == ~(uint)pCVar16[1] >> 0x1f)) {
                    pCVar16 = pCVar16 + 1;
                    goto LAB_00263477;
                  }
                  lVar29 = lVar29 + -1;
                  pCVar16 = pCVar16 + 4;
                } while (1 < lVar29);
                uVar24 = (long)local_108.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(&(local_108.
                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + uVar14);
                pCVar16 = (CliqueVar *)
                          (&(local_108.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + uVar14);
              }
              lVar29 = (long)uVar24 >> 2;
              if (lVar29 == 3) {
                pdVar27 = (globaldomain->col_lower_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar19 = (globaldomain->col_upper_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                uVar18 = (uint)*pCVar16 & 0x7fffffff;
                dVar4 = pdVar27[uVar18];
                if (((dVar4 != pdVar19[uVar18]) || (NAN(dVar4) || NAN(pdVar19[uVar18]))) ||
                   ((int)dVar4 != ~(uint)*pCVar16 >> 0x1f)) {
                  pCVar16 = pCVar16 + 1;
                  goto LAB_00263409;
                }
LAB_00263477:
                pCVar17 = pCVar16 + 1;
                if (pCVar17 !=
                    local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish &&
                    pCVar16 !=
                    local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  do {
                    CVar28 = *pCVar17;
                    dVar4 = (globaldomain->col_lower_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[(uint)CVar28 & 0x7fffffff];
                    pdVar3 = (globaldomain->col_upper_).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + ((uint)CVar28 & 0x7fffffff);
                    if (((dVar4 != *pdVar3) || (NAN(dVar4) || NAN(*pdVar3))) ||
                       ((int)dVar4 != ~(uint)CVar28 >> 0x1f)) {
                      *pCVar16 = CVar28;
                      pCVar16 = pCVar16 + 1;
                    }
                    pCVar17 = pCVar17 + 1;
                  } while (pCVar17 !=
                           local_108.
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
                }
                if (pCVar16 !=
                    local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  local_108.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pCVar16;
                }
              }
              else {
                if (lVar29 == 2) {
                  pdVar27 = (globaldomain->col_lower_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pdVar19 = (globaldomain->col_upper_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
LAB_00263409:
                  uVar18 = (uint)*pCVar16 & 0x7fffffff;
                  dVar4 = pdVar27[uVar18];
                  if (((dVar4 != pdVar19[uVar18]) || (NAN(dVar4) || NAN(pdVar19[uVar18]))) ||
                     ((int)dVar4 != ~(uint)*pCVar16 >> 0x1f)) {
                    pCVar16 = pCVar16 + 1;
                    goto LAB_0026343b;
                  }
                  goto LAB_00263477;
                }
                if (lVar29 == 1) {
                  pdVar27 = (globaldomain->col_lower_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pdVar19 = (globaldomain->col_upper_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
LAB_0026343b:
                  uVar18 = (uint)*pCVar16 & 0x7fffffff;
                  dVar4 = pdVar27[uVar18];
                  if ((int)dVar4 != ~(uint)*pCVar16 >> 0x1f) {
                    pCVar16 = local_108.
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                  if (dVar4 != pdVar19[uVar18]) {
                    pCVar16 = local_108.
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                  if (NAN(dVar4) || NAN(pdVar19[uVar18])) {
                    pCVar16 = local_108.
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                  goto LAB_00263477;
                }
              }
              uVar24 = (long)local_108.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_108.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 2;
              if (1 < uVar24) {
                doAddClique(this,local_108.
                                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 ._M_impl.super__Vector_impl_data._M_start,(HighsInt)uVar24,false,
                            local_ec);
              }
            }
LAB_0026350d:
            if (local_108.
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_108.
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              local_108.
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_108.
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_start;
            }
            processInfeasibleVertices(this,globaldomain);
            uVar24 = local_98;
            uVar14 = local_b8;
            this_00 = local_78;
            if (local_c4 <= this->numEntries) break;
          }
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar24);
    if ((local_a0 & 1) != 0) {
      lVar29 = 8;
      uVar24 = 0;
      do {
        pCVar7 = (this->cliques).
                 super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar20 = (long)*(int *)((long)pCVar7 + lVar29 + -8);
        if ((lVar20 != -1) && (*(int *)((long)&pCVar7->start + lVar29) == -1)) {
          if (local_108.
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_108.
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_108.
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_108.
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
                    ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                      *)&local_108,
                     local_108.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->cliqueentries).
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar20);
          removeClique(this,(HighsInt)uVar24);
          runCliqueMerging(this,globaldomain,&local_108,false);
          uVar14 = (long)local_108.
                         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_108.
                         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2;
          if (1 < uVar14) {
            doAddClique(this,local_108.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_start,(HighsInt)uVar14,false,
                        0x7fffffff);
          }
        }
        uVar24 = uVar24 + 1;
        lVar29 = lVar29 + 0x14;
      } while (local_98 != uVar24);
    }
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_start != (CliqueVar *)0x0) {
    operator_delete(local_108.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsCliqueTable::runCliqueMerging(HighsDomain& globaldomain) {
  std::vector<CliqueVar> extensionvars;
  iscandidate.resize(invertedHashList.size());
  std::vector<HighsInt> neighbourhoodInds;
  neighbourhoodInds.reserve(invertedHashList.size());

  if (cliquehits.size() < cliques.size()) cliquehits.resize(cliques.size());

  HighsInt numcliqueslots = cliques.size();
  const HighsInt maxNewEntries = numEntries + globaldomain.numModelNonzeros();
  bool haveNonModelCliquesToMerge = false;
  for (HighsInt k = 0; k != numcliqueslots; ++k) {
    if (cliques[k].start == -1) continue;
    if (!cliques[k].equality && cliques[k].origin == kHighsIInf) continue;
    if (cliques[k].origin == -1) {
      haveNonModelCliquesToMerge = true;
      continue;
    }
    HighsInt numclqvars = cliques[k].end - cliques[k].start;
    assert(numclqvars != 0);
    if (numclqvars == 0) continue;

    CliqueVar* clqvars = &cliqueentries[cliques[k].start];

    CliqueVar extensionstart = clqvars[0];
    HighsInt numcliques = numCliques(clqvars[0]);
    for (HighsInt i = 1; i != numclqvars; ++i) {
      HighsInt thisNumClqs = numCliques(clqvars[i]);
      if (thisNumClqs < numcliques) {
        numcliques = thisNumClqs;
        extensionstart = clqvars[i];
      }
    }

    for (HighsInt i = 0; i != numclqvars; ++i)
      iscandidate[clqvars[i].index()] = true;

    auto addCands = [&](HighsInt cliqueid) {
      HighsInt start = cliques[cliqueid].start;
      HighsInt end = cliques[cliqueid].end;

      for (HighsInt i = start; i != end; ++i) {
        if (iscandidate[cliqueentries[i].index()] ||
            globaldomain.isFixed(cliqueentries[i].col))
          continue;

        iscandidate[cliqueentries[i].index()] = true;
        extensionvars.push_back(cliqueentries[i]);
      }
    };

    invertedHashList[extensionstart.index()].for_each(
        [&](HighsInt cliqueid) { addCands(cliqueid); });

    invertedHashListSizeTwo[extensionstart.index()].for_each(
        [&](HighsInt cliqueid) { addCands(cliqueid); });

    for (HighsInt i = 0; i != numclqvars; ++i)
      iscandidate[clqvars[i].index()] = false;
    for (CliqueVar v : extensionvars) iscandidate[v.index()] = false;

    for (HighsInt i = 0; i != numclqvars && !extensionvars.empty(); ++i) {
      if (clqvars[i] == extensionstart) continue;

      HighsInt newSize = shrinkToNeighbourhood(
          neighbourhoodInds, numNeighbourhoodQueries, clqvars[i],
          extensionvars.data(), extensionvars.size());
      extensionvars.erase(extensionvars.begin() + newSize, extensionvars.end());
    }

    if (!extensionvars.empty()) {
      // todo, shuffle extension vars?
      randgen.shuffle(extensionvars.data(), extensionvars.size());
      size_t i = 0;
      while (i < extensionvars.size()) {
        CliqueVar extvar = extensionvars[i];
        i += 1;

        HighsInt newSize =
            i + shrinkToNeighbourhood(
                    neighbourhoodInds, numNeighbourhoodQueries, extvar,
                    extensionvars.data() + i, extensionvars.size() - i);
        extensionvars.erase(extensionvars.begin() + newSize,
                            extensionvars.end());
      }
    }

    if (cliques[k].equality) {
      for (CliqueVar v : extensionvars)
        vertexInfeasible(globaldomain, v.col, v.val);
    } else {
      HighsInt originrow = cliques[k].origin;
      cliques[k].origin = kHighsIInf;

      HighsInt numExtensions = extensionvars.size();
      extensionvars.insert(extensionvars.end(),
                           cliqueentries.begin() + cliques[k].start,
                           cliqueentries.begin() + cliques[k].end);
      extensionvars.erase(
          std::remove_if(
              extensionvars.begin() + numExtensions, extensionvars.end(),
              [&](CliqueVar clqvar) { return colDeleted[clqvar.col]; }),
          extensionvars.end());
      removeClique(k);

      for (CliqueVar v : extensionvars) {
        invertedHashList[v.index()].for_each([&](HighsInt cliqueid) {
          if (cliquehits[cliqueid] == 0) cliquehitinds.push_back(cliqueid);

          ++cliquehits[cliqueid];
        });

        invertedHashListSizeTwo[v.index()].for_each([&](HighsInt cliqueid) {
          if (cliquehits[cliqueid] == 0) cliquehitinds.push_back(cliqueid);

          ++cliquehits[cliqueid];
        });
      }

      bool redundant = false;
      HighsInt dominatingOrigin = kHighsIInf;
      for (HighsInt cliqueid : cliquehitinds) {
        HighsInt hits = cliquehits[cliqueid];
        cliquehits[cliqueid] = 0;

        if (hits == (HighsInt)extensionvars.size()) {
          redundant = true;
          if (cliques[cliqueid].origin != kHighsIInf &&
              cliques[cliqueid].origin != -1)
            dominatingOrigin = cliques[cliqueid].origin;
        } else if (cliques[cliqueid].end - cliques[cliqueid].start -
                       cliques[cliqueid].numZeroFixed ==
                   hits) {
          if (cliques[cliqueid].equality) {
            for (CliqueVar v : extensionvars) {
              bool sizeTwo =
                  cliques[cliqueid].end - cliques[cliqueid].start == 2;
              bool vHasClq =
                  sizeTwo
                      ? invertedHashListSizeTwo[v.index()].contains(cliqueid)
                      : invertedHashList[v.index()].contains(cliqueid);
              if (!vHasClq) infeasvertexstack.push_back(v);
            }
          } else {
            removeClique(cliqueid);
          }
        }
      }

      cliquehitinds.clear();

      if (!redundant) {
        for (HighsInt i = 0; i < numExtensions; ++i)
          cliqueextensions.emplace_back(originrow, extensionvars[i]);

        extensionvars.erase(
            std::remove_if(extensionvars.begin(), extensionvars.end(),
                           [&](CliqueVar v) {
                             return globaldomain.isFixed(v.col) &&
                                    static_cast<int>(
                                        globaldomain.col_lower_[v.col]) ==
                                        static_cast<int>(1 - v.val);
                           }),
            extensionvars.end());

        if (extensionvars.size() > 1)
          doAddClique(extensionvars.data(), extensionvars.size(), false,
                      originrow);
      } else {
        // the extended clique is redundant, check if the row can be removed
        if (dominatingOrigin != kHighsIInf)
          deletedrows.push_back(originrow);
        else {
          // this clique is redundant in the cliquetable but its row is not
          // necessarily. Also there might be rows that have been deleted due to
          // being dominated by this row after adding the lifted entries so they
          // must be added to the cliqueextension vector
          for (HighsInt i = 0; i < numExtensions; ++i)
            cliqueextensions.emplace_back(originrow, extensionvars[i]);
        }
      }
    }

    extensionvars.clear();
    processInfeasibleVertices(globaldomain);

    if (numEntries >= maxNewEntries) break;
    // printf("nonzeroDelta: %d, maxNonzeroDelta: %d\n", nonzeroDelta,
    // maxNonzeroDelta);
  }

  if (haveNonModelCliquesToMerge) {
    for (HighsInt k = 0; k != numcliqueslots; ++k) {
      if (cliques[k].start == -1) continue;
      if (cliques[k].origin != -1) continue;
      // if (cliques[k].end - cliques[k].start <= 1000) continue;

      // printf("numEntries before: %d\n", numEntries);
      extensionvars.clear();
      extensionvars.insert(extensionvars.end(),
                           cliqueentries.begin() + cliques[k].start,
                           cliqueentries.begin() + cliques[k].end);
      removeClique(k);
      runCliqueMerging(globaldomain, extensionvars);

      if (extensionvars.size() > 1)
        doAddClique(extensionvars.data(), extensionvars.size());
    }
  }
}